

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddLanguageFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  bool bVar1;
  allocator local_51;
  undefined1 local_50 [8];
  string flagsVar;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  flagsVar.field_2._8_8_ = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"CMAKE_",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::operator+=((string *)local_50,(string *)lang);
  std::__cxx11::string::operator+=((string *)local_50,"_FLAGS");
  AddConfigVariableFlags(this,flags,(string *)local_50,(string *)flagsVar.field_2._8_8_);
  bVar1 = cmGeneratorTarget::IsIPOEnabled(target,lang,(string *)flagsVar.field_2._8_8_);
  if (bVar1) {
    AppendFeatureOptions(this,flags,lang,"IPO");
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        cmGeneratorTarget const* target,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  std::string flagsVar = "CMAKE_";
  flagsVar += lang;
  flagsVar += "_FLAGS";
  this->AddConfigVariableFlags(flags, flagsVar, config);

  if (target->IsIPOEnabled(lang, config)) {
    this->AppendFeatureOptions(flags, lang, "IPO");
  }
}